

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrdb.cpp
# Opt level: O0

void __thiscall CBanDB::CBanDB(CBanDB *this,path *ban_list_path)

{
  long lVar1;
  char *in_RSI;
  path *in_RDI;
  long in_FS_OFFSET;
  path *in_stack_ffffffffffffff58;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  fs::path::path(in_stack_ffffffffffffff58,(path *)0x86ed49);
  fs::operator+(in_RDI,in_RSI);
  fs::path::~path(in_stack_ffffffffffffff58);
  fs::path::path(in_stack_ffffffffffffff58,(path *)0x86ed88);
  fs::operator+(in_RDI,in_RSI);
  fs::path::~path(in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CBanDB::CBanDB(fs::path ban_list_path)
    : m_banlist_dat(ban_list_path + ".dat"),
      m_banlist_json(ban_list_path + ".json")
{
}